

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O2

void WriteLispStringToPipe(LispPTR lispstr)

{
  LispPTR *pLVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  LispPTR LVar5;
  DLword *pDVar6;
  uint uVar7;
  unsigned_short len;
  
  pLVar1 = NativeAligned4FromLAddr(lispstr);
  pDVar6 = Lisp_world;
  LVar5 = 0x800;
  if ((int)pLVar1[2] < 0x800) {
    LVar5 = pLVar1[2];
  }
  lVar4 = (long)(int)LVar5;
  if (*(char *)((long)pLVar1 + 6) == 'D') {
    pDVar6 = Lisp_world + (ulong)(ushort)pLVar1[1] + (ulong)(*pLVar1 & 0xfffffff);
    for (lVar2 = 0; lVar4 != lVar2; lVar2 = lVar2 + 1) {
      shcom[lVar2] = *(char *)((ulong)pDVar6 ^ 2);
      pDVar6 = pDVar6 + 1;
    }
    shcom[lVar2] = '\0';
  }
  else if (*(char *)((long)pLVar1 + 6) == 'C') {
    uVar7 = *pLVar1;
    LVar5 = pLVar1[1];
    for (lVar2 = 0; lVar4 != lVar2; lVar2 = lVar2 + 1) {
      shcom[lVar2] = *(char *)((long)pDVar6 +
                               lVar2 + (ulong)(ushort)LVar5 + (ulong)(uVar7 & 0xfffffff) * 2 ^ 3);
    }
    shcom[lVar4] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  sVar3 = strlen(shcom);
  uVar7 = (int)sVar3 + 1;
  len = (unsigned_short)uVar7;
  write(UnixPipeOut,&len,2);
  write(UnixPipeOut,shcom,(ulong)(uVar7 & 0xffff));
  return;
}

Assistant:

void WriteLispStringToPipe(LispPTR lispstr) {
  unsigned short len;
  LispStringToCString(lispstr, shcom, 2048);
  /* Write string length, then string */
  len = strlen(shcom) + 1;
  write(UnixPipeOut, &len, 2);
  write(UnixPipeOut, shcom, len);
}